

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netbase_tests.cpp
# Opt level: O0

void __thiscall netbase_tests::netbase_getgroup::test_method(netbase_getgroup *this)

{
  initializer_list<unsigned_char> __l;
  initializer_list<unsigned_char> __l_00;
  initializer_list<unsigned_char> __l_01;
  initializer_list<unsigned_char> __l_02;
  initializer_list<unsigned_char> __l_03;
  initializer_list<unsigned_char> __l_04;
  initializer_list<unsigned_char> __l_05;
  initializer_list<unsigned_char> __l_06;
  initializer_list<unsigned_char> __l_07;
  initializer_list<unsigned_char> __l_08;
  initializer_list<unsigned_char> __l_09;
  initializer_list<unsigned_char> __l_10;
  bool bVar1;
  long in_FS_OFFSET;
  vector<unsigned_char,_std::allocator<unsigned_char>_> internal_group;
  NetGroupManager netgroupman;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff0a8;
  undefined7 in_stack_fffffffffffff0b0;
  undefined1 in_stack_fffffffffffff0b7;
  undefined7 in_stack_fffffffffffff0b8;
  undefined1 in_stack_fffffffffffff0bf;
  string *in_stack_fffffffffffff0d0;
  string *in_stack_fffffffffffff0d8;
  NetGroupManager *__x;
  const_string *in_stack_fffffffffffff0e0;
  const_string *file;
  undefined7 in_stack_fffffffffffff0e8;
  undefined1 in_stack_fffffffffffff0ef;
  lazy_ostream *in_stack_fffffffffffff0f0;
  undefined7 in_stack_fffffffffffff0f8;
  undefined1 in_stack_fffffffffffff0ff;
  CNetAddr *in_stack_fffffffffffff138;
  CNetAddr *address;
  NetGroupManager *in_stack_fffffffffffff140;
  NetGroupManager *this_00;
  const_string local_c28 [2];
  lazy_ostream local_c08 [2];
  undefined1 local_be1 [88];
  const_string local_b89;
  const_string local_b70 [2];
  lazy_ostream local_b50 [4];
  allocator<char> local_b09 [25];
  assertion_result local_af0 [2];
  const_string local_ab8 [2];
  lazy_ostream local_a98 [4];
  undefined1 local_a51 [81];
  const_string local_a00 [2];
  lazy_ostream local_9e0 [4];
  allocator<char> local_999 [25];
  assertion_result local_980 [2];
  const_string local_948 [2];
  lazy_ostream local_928 [4];
  allocator<char> local_8e1 [25];
  assertion_result local_8c8 [2];
  const_string local_890 [2];
  lazy_ostream local_870 [4];
  allocator<char> local_829 [25];
  assertion_result local_810 [2];
  const_string local_7d8 [2];
  lazy_ostream local_7b8 [4];
  allocator<char> local_771 [25];
  assertion_result local_758 [2];
  const_string local_720 [2];
  lazy_ostream local_700 [4];
  allocator<char> local_6b9 [25];
  assertion_result local_6a0 [2];
  const_string local_668 [2];
  lazy_ostream local_648 [4];
  allocator<char> local_601 [25];
  assertion_result local_5e8 [2];
  const_string local_5b0 [2];
  lazy_ostream local_590 [4];
  allocator<char> local_549 [25];
  assertion_result local_530 [2];
  const_string local_4f8 [2];
  lazy_ostream local_4d8 [4];
  allocator<char> local_491 [25];
  assertion_result local_478 [2];
  const_string local_440 [2];
  lazy_ostream local_420 [4];
  allocator<char> local_3d9 [25];
  assertion_result local_3c0 [2];
  undefined1 local_386;
  undefined1 local_385;
  undefined1 local_384;
  undefined1 local_383;
  undefined1 local_382;
  undefined1 local_381;
  undefined1 local_380;
  undefined1 local_37f;
  undefined1 local_37e;
  undefined1 local_37d;
  undefined1 local_37c;
  undefined1 local_37b;
  undefined1 local_37a;
  undefined1 local_379;
  undefined1 local_378;
  undefined1 local_377;
  undefined1 local_376;
  undefined1 local_375;
  undefined1 local_374;
  undefined1 local_373;
  undefined1 local_372;
  undefined1 local_371;
  undefined1 local_370;
  undefined1 local_36f;
  undefined1 local_36e;
  undefined1 local_36d;
  undefined1 local_36c;
  undefined1 local_36b;
  undefined1 local_36a;
  undefined1 local_369;
  undefined8 local_368;
  undefined8 uStack_360;
  undefined8 local_358;
  undefined8 uStack_350;
  undefined8 local_348;
  undefined1 local_2d3;
  undefined1 local_2d2;
  undefined1 local_2d1;
  undefined1 local_2d0;
  undefined1 local_2cf;
  undefined1 local_2ce;
  undefined1 local_2cd;
  undefined1 local_2cc;
  undefined1 local_2cb;
  undefined1 local_2ca;
  undefined1 local_2c9;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_358 = 0;
  uStack_350 = 0;
  local_368 = 0;
  uStack_360 = 0;
  local_348 = 0;
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)in_stack_fffffffffffff0a8);
  NetGroupManager::NetGroupManager
            ((NetGroupManager *)in_stack_fffffffffffff0a8,
             (vector<bool,_std::allocator<bool>_> *)0x8bc08d);
  std::vector<bool,_std::allocator<bool>_>::~vector
            ((vector<bool,_std::allocator<bool>_> *)in_stack_fffffffffffff0a8);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff0bf,in_stack_fffffffffffff0b8),
               (pointer)CONCAT17(in_stack_fffffffffffff0b7,in_stack_fffffffffffff0b0),
               (unsigned_long)in_stack_fffffffffffff0a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff0a8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff0ef,in_stack_fffffffffffff0e8),
               in_stack_fffffffffffff0e0,(size_t)in_stack_fffffffffffff0d8,
               (const_string *)in_stack_fffffffffffff0d0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffff0ff,in_stack_fffffffffffff0f8),
               (char *)in_stack_fffffffffffff0f0,
               (allocator<char> *)CONCAT17(in_stack_fffffffffffff0ef,in_stack_fffffffffffff0e8));
    ResolveIP(in_stack_fffffffffffff0d8);
    NetGroupManager::GetGroup(in_stack_fffffffffffff140,in_stack_fffffffffffff138);
    local_369 = 0;
    std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)in_stack_fffffffffffff0a8);
    __l._M_len._0_7_ = in_stack_fffffffffffff0f8;
    __l._M_array = (iterator)in_stack_fffffffffffff0f0;
    __l._M_len._7_1_ = in_stack_fffffffffffff0ff;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT17(in_stack_fffffffffffff0ef,in_stack_fffffffffffff0e8),__l,
               (allocator_type *)in_stack_fffffffffffff0e0);
    std::operator==((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                    in_stack_fffffffffffff0d8,
                    (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                    in_stack_fffffffffffff0d0);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_fffffffffffff0bf,in_stack_fffffffffffff0b8),
               (bool)in_stack_fffffffffffff0b7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff0bf,in_stack_fffffffffffff0b8),
               (pointer)CONCAT17(in_stack_fffffffffffff0b7,in_stack_fffffffffffff0b0),
               (unsigned_long)in_stack_fffffffffffff0a8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff0b7,in_stack_fffffffffffff0b0),
               (basic_cstring<const_char> *)in_stack_fffffffffffff0a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff0bf,in_stack_fffffffffffff0b8),
               (pointer)CONCAT17(in_stack_fffffffffffff0b7,in_stack_fffffffffffff0b0),
               (unsigned_long)in_stack_fffffffffffff0a8);
    in_stack_fffffffffffff0a8 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_3c0,local_420,local_440,0x147,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff0a8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff0a8);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT17(in_stack_fffffffffffff0bf,in_stack_fffffffffffff0b8));
    std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)in_stack_fffffffffffff0a8)
    ;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT17(in_stack_fffffffffffff0bf,in_stack_fffffffffffff0b8));
    CNetAddr::~CNetAddr((CNetAddr *)in_stack_fffffffffffff0a8);
    std::__cxx11::string::~string(in_stack_fffffffffffff0a8);
    std::allocator<char>::~allocator(local_3d9);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff0bf,in_stack_fffffffffffff0b8),
               (pointer)CONCAT17(in_stack_fffffffffffff0b7,in_stack_fffffffffffff0b0),
               (unsigned_long)in_stack_fffffffffffff0a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff0a8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff0ef,in_stack_fffffffffffff0e8),
               in_stack_fffffffffffff0e0,(size_t)in_stack_fffffffffffff0d8,
               (const_string *)in_stack_fffffffffffff0d0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffff0ff,in_stack_fffffffffffff0f8),
               (char *)in_stack_fffffffffffff0f0,
               (allocator<char> *)CONCAT17(in_stack_fffffffffffff0ef,in_stack_fffffffffffff0e8));
    ResolveIP(in_stack_fffffffffffff0d8);
    NetGroupManager::GetGroup(in_stack_fffffffffffff140,in_stack_fffffffffffff138);
    local_36a = 0;
    std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)in_stack_fffffffffffff0a8);
    __l_00._M_len._0_7_ = in_stack_fffffffffffff0f8;
    __l_00._M_array = (iterator)in_stack_fffffffffffff0f0;
    __l_00._M_len._7_1_ = in_stack_fffffffffffff0ff;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT17(in_stack_fffffffffffff0ef,in_stack_fffffffffffff0e8),__l_00,
               (allocator_type *)in_stack_fffffffffffff0e0);
    std::operator==((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                    in_stack_fffffffffffff0d8,
                    (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                    in_stack_fffffffffffff0d0);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_fffffffffffff0bf,in_stack_fffffffffffff0b8),
               (bool)in_stack_fffffffffffff0b7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff0bf,in_stack_fffffffffffff0b8),
               (pointer)CONCAT17(in_stack_fffffffffffff0b7,in_stack_fffffffffffff0b0),
               (unsigned_long)in_stack_fffffffffffff0a8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff0b7,in_stack_fffffffffffff0b0),
               (basic_cstring<const_char> *)in_stack_fffffffffffff0a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff0bf,in_stack_fffffffffffff0b8),
               (pointer)CONCAT17(in_stack_fffffffffffff0b7,in_stack_fffffffffffff0b0),
               (unsigned_long)in_stack_fffffffffffff0a8);
    in_stack_fffffffffffff0a8 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_478,local_4d8,local_4f8,0x148,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff0a8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff0a8);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT17(in_stack_fffffffffffff0bf,in_stack_fffffffffffff0b8));
    std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)in_stack_fffffffffffff0a8)
    ;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT17(in_stack_fffffffffffff0bf,in_stack_fffffffffffff0b8));
    CNetAddr::~CNetAddr((CNetAddr *)in_stack_fffffffffffff0a8);
    std::__cxx11::string::~string(in_stack_fffffffffffff0a8);
    std::allocator<char>::~allocator(local_491);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff0bf,in_stack_fffffffffffff0b8),
               (pointer)CONCAT17(in_stack_fffffffffffff0b7,in_stack_fffffffffffff0b0),
               (unsigned_long)in_stack_fffffffffffff0a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff0a8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff0ef,in_stack_fffffffffffff0e8),
               in_stack_fffffffffffff0e0,(size_t)in_stack_fffffffffffff0d8,
               (const_string *)in_stack_fffffffffffff0d0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffff0ff,in_stack_fffffffffffff0f8),
               (char *)in_stack_fffffffffffff0f0,
               (allocator<char> *)CONCAT17(in_stack_fffffffffffff0ef,in_stack_fffffffffffff0e8));
    ResolveIP(in_stack_fffffffffffff0d8);
    NetGroupManager::GetGroup(in_stack_fffffffffffff140,in_stack_fffffffffffff138);
    local_36b = 0;
    std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)in_stack_fffffffffffff0a8);
    __l_01._M_len._0_7_ = in_stack_fffffffffffff0f8;
    __l_01._M_array = (iterator)in_stack_fffffffffffff0f0;
    __l_01._M_len._7_1_ = in_stack_fffffffffffff0ff;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT17(in_stack_fffffffffffff0ef,in_stack_fffffffffffff0e8),__l_01,
               (allocator_type *)in_stack_fffffffffffff0e0);
    std::operator==((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                    in_stack_fffffffffffff0d8,
                    (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                    in_stack_fffffffffffff0d0);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_fffffffffffff0bf,in_stack_fffffffffffff0b8),
               (bool)in_stack_fffffffffffff0b7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff0bf,in_stack_fffffffffffff0b8),
               (pointer)CONCAT17(in_stack_fffffffffffff0b7,in_stack_fffffffffffff0b0),
               (unsigned_long)in_stack_fffffffffffff0a8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff0b7,in_stack_fffffffffffff0b0),
               (basic_cstring<const_char> *)in_stack_fffffffffffff0a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff0bf,in_stack_fffffffffffff0b8),
               (pointer)CONCAT17(in_stack_fffffffffffff0b7,in_stack_fffffffffffff0b0),
               (unsigned_long)in_stack_fffffffffffff0a8);
    in_stack_fffffffffffff0a8 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_530,local_590,local_5b0,0x149,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff0a8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff0a8);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT17(in_stack_fffffffffffff0bf,in_stack_fffffffffffff0b8));
    std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)in_stack_fffffffffffff0a8)
    ;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT17(in_stack_fffffffffffff0bf,in_stack_fffffffffffff0b8));
    CNetAddr::~CNetAddr((CNetAddr *)in_stack_fffffffffffff0a8);
    std::__cxx11::string::~string(in_stack_fffffffffffff0a8);
    std::allocator<char>::~allocator(local_549);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff0bf,in_stack_fffffffffffff0b8),
               (pointer)CONCAT17(in_stack_fffffffffffff0b7,in_stack_fffffffffffff0b0),
               (unsigned_long)in_stack_fffffffffffff0a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff0a8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff0ef,in_stack_fffffffffffff0e8),
               in_stack_fffffffffffff0e0,(size_t)in_stack_fffffffffffff0d8,
               (const_string *)in_stack_fffffffffffff0d0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffff0ff,in_stack_fffffffffffff0f8),
               (char *)in_stack_fffffffffffff0f0,
               (allocator<char> *)CONCAT17(in_stack_fffffffffffff0ef,in_stack_fffffffffffff0e8));
    ResolveIP(in_stack_fffffffffffff0d8);
    NetGroupManager::GetGroup(in_stack_fffffffffffff140,in_stack_fffffffffffff138);
    local_36c = 0;
    std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)in_stack_fffffffffffff0a8);
    __l_02._M_len._0_7_ = in_stack_fffffffffffff0f8;
    __l_02._M_array = (iterator)in_stack_fffffffffffff0f0;
    __l_02._M_len._7_1_ = in_stack_fffffffffffff0ff;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT17(in_stack_fffffffffffff0ef,in_stack_fffffffffffff0e8),__l_02,
               (allocator_type *)in_stack_fffffffffffff0e0);
    std::operator==((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                    in_stack_fffffffffffff0d8,
                    (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                    in_stack_fffffffffffff0d0);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_fffffffffffff0bf,in_stack_fffffffffffff0b8),
               (bool)in_stack_fffffffffffff0b7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff0bf,in_stack_fffffffffffff0b8),
               (pointer)CONCAT17(in_stack_fffffffffffff0b7,in_stack_fffffffffffff0b0),
               (unsigned_long)in_stack_fffffffffffff0a8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff0b7,in_stack_fffffffffffff0b0),
               (basic_cstring<const_char> *)in_stack_fffffffffffff0a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff0bf,in_stack_fffffffffffff0b8),
               (pointer)CONCAT17(in_stack_fffffffffffff0b7,in_stack_fffffffffffff0b0),
               (unsigned_long)in_stack_fffffffffffff0a8);
    in_stack_fffffffffffff0a8 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_5e8,local_648,local_668,0x14a,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff0a8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff0a8);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT17(in_stack_fffffffffffff0bf,in_stack_fffffffffffff0b8));
    std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)in_stack_fffffffffffff0a8)
    ;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT17(in_stack_fffffffffffff0bf,in_stack_fffffffffffff0b8));
    CNetAddr::~CNetAddr((CNetAddr *)in_stack_fffffffffffff0a8);
    std::__cxx11::string::~string(in_stack_fffffffffffff0a8);
    std::allocator<char>::~allocator(local_601);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff0bf,in_stack_fffffffffffff0b8),
               (pointer)CONCAT17(in_stack_fffffffffffff0b7,in_stack_fffffffffffff0b0),
               (unsigned_long)in_stack_fffffffffffff0a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff0a8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff0ef,in_stack_fffffffffffff0e8),
               in_stack_fffffffffffff0e0,(size_t)in_stack_fffffffffffff0d8,
               (const_string *)in_stack_fffffffffffff0d0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffff0ff,in_stack_fffffffffffff0f8),
               (char *)in_stack_fffffffffffff0f0,
               (allocator<char> *)CONCAT17(in_stack_fffffffffffff0ef,in_stack_fffffffffffff0e8));
    ResolveIP(in_stack_fffffffffffff0d8);
    NetGroupManager::GetGroup(in_stack_fffffffffffff140,in_stack_fffffffffffff138);
    local_36f = 1;
    local_36e = 1;
    local_36d = 2;
    std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)in_stack_fffffffffffff0a8);
    __l_03._M_len._0_7_ = in_stack_fffffffffffff0f8;
    __l_03._M_array = (iterator)in_stack_fffffffffffff0f0;
    __l_03._M_len._7_1_ = in_stack_fffffffffffff0ff;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT17(in_stack_fffffffffffff0ef,in_stack_fffffffffffff0e8),__l_03,
               (allocator_type *)in_stack_fffffffffffff0e0);
    std::operator==((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                    in_stack_fffffffffffff0d8,
                    (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                    in_stack_fffffffffffff0d0);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_fffffffffffff0bf,in_stack_fffffffffffff0b8),
               (bool)in_stack_fffffffffffff0b7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff0bf,in_stack_fffffffffffff0b8),
               (pointer)CONCAT17(in_stack_fffffffffffff0b7,in_stack_fffffffffffff0b0),
               (unsigned_long)in_stack_fffffffffffff0a8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff0b7,in_stack_fffffffffffff0b0),
               (basic_cstring<const_char> *)in_stack_fffffffffffff0a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff0bf,in_stack_fffffffffffff0b8),
               (pointer)CONCAT17(in_stack_fffffffffffff0b7,in_stack_fffffffffffff0b0),
               (unsigned_long)in_stack_fffffffffffff0a8);
    in_stack_fffffffffffff0a8 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_6a0,local_700,local_720,0x14b,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff0a8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff0a8);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT17(in_stack_fffffffffffff0bf,in_stack_fffffffffffff0b8));
    std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)in_stack_fffffffffffff0a8)
    ;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT17(in_stack_fffffffffffff0bf,in_stack_fffffffffffff0b8));
    CNetAddr::~CNetAddr((CNetAddr *)in_stack_fffffffffffff0a8);
    std::__cxx11::string::~string(in_stack_fffffffffffff0a8);
    std::allocator<char>::~allocator(local_6b9);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff0bf,in_stack_fffffffffffff0b8),
               (pointer)CONCAT17(in_stack_fffffffffffff0b7,in_stack_fffffffffffff0b0),
               (unsigned_long)in_stack_fffffffffffff0a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff0a8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff0ef,in_stack_fffffffffffff0e8),
               in_stack_fffffffffffff0e0,(size_t)in_stack_fffffffffffff0d8,
               (const_string *)in_stack_fffffffffffff0d0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffff0ff,in_stack_fffffffffffff0f8),
               (char *)in_stack_fffffffffffff0f0,
               (allocator<char> *)CONCAT17(in_stack_fffffffffffff0ef,in_stack_fffffffffffff0e8));
    ResolveIP(in_stack_fffffffffffff0d8);
    NetGroupManager::GetGroup(in_stack_fffffffffffff140,in_stack_fffffffffffff138);
    local_372 = 1;
    local_371 = 1;
    local_370 = 2;
    std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)in_stack_fffffffffffff0a8);
    __l_04._M_len._0_7_ = in_stack_fffffffffffff0f8;
    __l_04._M_array = (iterator)in_stack_fffffffffffff0f0;
    __l_04._M_len._7_1_ = in_stack_fffffffffffff0ff;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT17(in_stack_fffffffffffff0ef,in_stack_fffffffffffff0e8),__l_04,
               (allocator_type *)in_stack_fffffffffffff0e0);
    std::operator==((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                    in_stack_fffffffffffff0d8,
                    (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                    in_stack_fffffffffffff0d0);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_fffffffffffff0bf,in_stack_fffffffffffff0b8),
               (bool)in_stack_fffffffffffff0b7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff0bf,in_stack_fffffffffffff0b8),
               (pointer)CONCAT17(in_stack_fffffffffffff0b7,in_stack_fffffffffffff0b0),
               (unsigned_long)in_stack_fffffffffffff0a8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff0b7,in_stack_fffffffffffff0b0),
               (basic_cstring<const_char> *)in_stack_fffffffffffff0a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff0bf,in_stack_fffffffffffff0b8),
               (pointer)CONCAT17(in_stack_fffffffffffff0b7,in_stack_fffffffffffff0b0),
               (unsigned_long)in_stack_fffffffffffff0a8);
    in_stack_fffffffffffff0a8 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_758,local_7b8,local_7d8,0x14c,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff0a8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff0a8);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT17(in_stack_fffffffffffff0bf,in_stack_fffffffffffff0b8));
    std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)in_stack_fffffffffffff0a8)
    ;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT17(in_stack_fffffffffffff0bf,in_stack_fffffffffffff0b8));
    CNetAddr::~CNetAddr((CNetAddr *)in_stack_fffffffffffff0a8);
    std::__cxx11::string::~string(in_stack_fffffffffffff0a8);
    std::allocator<char>::~allocator(local_771);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff0bf,in_stack_fffffffffffff0b8),
               (pointer)CONCAT17(in_stack_fffffffffffff0b7,in_stack_fffffffffffff0b0),
               (unsigned_long)in_stack_fffffffffffff0a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff0a8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff0ef,in_stack_fffffffffffff0e8),
               in_stack_fffffffffffff0e0,(size_t)in_stack_fffffffffffff0d8,
               (const_string *)in_stack_fffffffffffff0d0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffff0ff,in_stack_fffffffffffff0f8),
               (char *)in_stack_fffffffffffff0f0,
               (allocator<char> *)CONCAT17(in_stack_fffffffffffff0ef,in_stack_fffffffffffff0e8));
    ResolveIP(in_stack_fffffffffffff0d8);
    NetGroupManager::GetGroup(in_stack_fffffffffffff140,in_stack_fffffffffffff138);
    local_375 = 1;
    local_374 = 1;
    local_373 = 2;
    std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)in_stack_fffffffffffff0a8);
    __l_05._M_len._0_7_ = in_stack_fffffffffffff0f8;
    __l_05._M_array = (iterator)in_stack_fffffffffffff0f0;
    __l_05._M_len._7_1_ = in_stack_fffffffffffff0ff;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT17(in_stack_fffffffffffff0ef,in_stack_fffffffffffff0e8),__l_05,
               (allocator_type *)in_stack_fffffffffffff0e0);
    std::operator==((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                    in_stack_fffffffffffff0d8,
                    (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                    in_stack_fffffffffffff0d0);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_fffffffffffff0bf,in_stack_fffffffffffff0b8),
               (bool)in_stack_fffffffffffff0b7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff0bf,in_stack_fffffffffffff0b8),
               (pointer)CONCAT17(in_stack_fffffffffffff0b7,in_stack_fffffffffffff0b0),
               (unsigned_long)in_stack_fffffffffffff0a8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff0b7,in_stack_fffffffffffff0b0),
               (basic_cstring<const_char> *)in_stack_fffffffffffff0a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff0bf,in_stack_fffffffffffff0b8),
               (pointer)CONCAT17(in_stack_fffffffffffff0b7,in_stack_fffffffffffff0b0),
               (unsigned_long)in_stack_fffffffffffff0a8);
    in_stack_fffffffffffff0a8 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_810,local_870,local_890,0x14d,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff0a8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff0a8);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT17(in_stack_fffffffffffff0bf,in_stack_fffffffffffff0b8));
    std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)in_stack_fffffffffffff0a8)
    ;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT17(in_stack_fffffffffffff0bf,in_stack_fffffffffffff0b8));
    CNetAddr::~CNetAddr((CNetAddr *)in_stack_fffffffffffff0a8);
    std::__cxx11::string::~string(in_stack_fffffffffffff0a8);
    std::allocator<char>::~allocator(local_829);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff0bf,in_stack_fffffffffffff0b8),
               (pointer)CONCAT17(in_stack_fffffffffffff0b7,in_stack_fffffffffffff0b0),
               (unsigned_long)in_stack_fffffffffffff0a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff0a8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff0ef,in_stack_fffffffffffff0e8),
               in_stack_fffffffffffff0e0,(size_t)in_stack_fffffffffffff0d8,
               (const_string *)in_stack_fffffffffffff0d0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffff0ff,in_stack_fffffffffffff0f8),
               (char *)in_stack_fffffffffffff0f0,
               (allocator<char> *)CONCAT17(in_stack_fffffffffffff0ef,in_stack_fffffffffffff0e8));
    ResolveIP(in_stack_fffffffffffff0d8);
    NetGroupManager::GetGroup(in_stack_fffffffffffff140,in_stack_fffffffffffff138);
    local_378 = 1;
    local_377 = 1;
    local_376 = 2;
    std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)in_stack_fffffffffffff0a8);
    __l_06._M_len._0_7_ = in_stack_fffffffffffff0f8;
    __l_06._M_array = (iterator)in_stack_fffffffffffff0f0;
    __l_06._M_len._7_1_ = in_stack_fffffffffffff0ff;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT17(in_stack_fffffffffffff0ef,in_stack_fffffffffffff0e8),__l_06,
               (allocator_type *)in_stack_fffffffffffff0e0);
    std::operator==((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                    in_stack_fffffffffffff0d8,
                    (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                    in_stack_fffffffffffff0d0);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_fffffffffffff0bf,in_stack_fffffffffffff0b8),
               (bool)in_stack_fffffffffffff0b7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff0bf,in_stack_fffffffffffff0b8),
               (pointer)CONCAT17(in_stack_fffffffffffff0b7,in_stack_fffffffffffff0b0),
               (unsigned_long)in_stack_fffffffffffff0a8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff0b7,in_stack_fffffffffffff0b0),
               (basic_cstring<const_char> *)in_stack_fffffffffffff0a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff0bf,in_stack_fffffffffffff0b8),
               (pointer)CONCAT17(in_stack_fffffffffffff0b7,in_stack_fffffffffffff0b0),
               (unsigned_long)in_stack_fffffffffffff0a8);
    in_stack_fffffffffffff0a8 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_8c8,local_928,local_948,0x14e,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff0a8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff0a8);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT17(in_stack_fffffffffffff0bf,in_stack_fffffffffffff0b8));
    std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)in_stack_fffffffffffff0a8)
    ;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT17(in_stack_fffffffffffff0bf,in_stack_fffffffffffff0b8));
    CNetAddr::~CNetAddr((CNetAddr *)in_stack_fffffffffffff0a8);
    std::__cxx11::string::~string(in_stack_fffffffffffff0a8);
    std::allocator<char>::~allocator(local_8e1);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff0bf,in_stack_fffffffffffff0b8),
               (pointer)CONCAT17(in_stack_fffffffffffff0b7,in_stack_fffffffffffff0b0),
               (unsigned_long)in_stack_fffffffffffff0a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff0a8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff0ef,in_stack_fffffffffffff0e8),
               in_stack_fffffffffffff0e0,(size_t)in_stack_fffffffffffff0d8,
               (const_string *)in_stack_fffffffffffff0d0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffff0ff,in_stack_fffffffffffff0f8),
               (char *)in_stack_fffffffffffff0f0,
               (allocator<char> *)CONCAT17(in_stack_fffffffffffff0ef,in_stack_fffffffffffff0e8));
    ResolveIP(in_stack_fffffffffffff0d8);
    NetGroupManager::GetGroup(in_stack_fffffffffffff140,in_stack_fffffffffffff138);
    local_37b = 1;
    local_37a = 1;
    local_379 = 2;
    std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)in_stack_fffffffffffff0a8);
    __l_07._M_len._0_7_ = in_stack_fffffffffffff0f8;
    __l_07._M_array = (iterator)in_stack_fffffffffffff0f0;
    __l_07._M_len._7_1_ = in_stack_fffffffffffff0ff;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT17(in_stack_fffffffffffff0ef,in_stack_fffffffffffff0e8),__l_07,
               (allocator_type *)in_stack_fffffffffffff0e0);
    std::operator==((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                    in_stack_fffffffffffff0d8,
                    (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                    in_stack_fffffffffffff0d0);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_fffffffffffff0bf,in_stack_fffffffffffff0b8),
               (bool)in_stack_fffffffffffff0b7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff0bf,in_stack_fffffffffffff0b8),
               (pointer)CONCAT17(in_stack_fffffffffffff0b7,in_stack_fffffffffffff0b0),
               (unsigned_long)in_stack_fffffffffffff0a8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff0b7,in_stack_fffffffffffff0b0),
               (basic_cstring<const_char> *)in_stack_fffffffffffff0a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff0bf,in_stack_fffffffffffff0b8),
               (pointer)CONCAT17(in_stack_fffffffffffff0b7,in_stack_fffffffffffff0b0),
               (unsigned_long)in_stack_fffffffffffff0a8);
    in_stack_fffffffffffff0a8 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_980,local_9e0,local_a00,0x14f,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff0a8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff0a8);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT17(in_stack_fffffffffffff0bf,in_stack_fffffffffffff0b8));
    std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)in_stack_fffffffffffff0a8)
    ;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT17(in_stack_fffffffffffff0bf,in_stack_fffffffffffff0b8));
    CNetAddr::~CNetAddr((CNetAddr *)in_stack_fffffffffffff0a8);
    std::__cxx11::string::~string(in_stack_fffffffffffff0a8);
    std::allocator<char>::~allocator(local_999);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    this_00 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff0bf,in_stack_fffffffffffff0b8),
               (pointer)CONCAT17(in_stack_fffffffffffff0b7,in_stack_fffffffffffff0b0),
               (unsigned_long)in_stack_fffffffffffff0a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff0a8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff0ef,in_stack_fffffffffffff0e8),
               in_stack_fffffffffffff0e0,(size_t)in_stack_fffffffffffff0d8,
               (const_string *)in_stack_fffffffffffff0d0);
    address = (CNetAddr *)local_a51;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffff0ff,in_stack_fffffffffffff0f8),
               (char *)in_stack_fffffffffffff0f0,
               (allocator<char> *)CONCAT17(in_stack_fffffffffffff0ef,in_stack_fffffffffffff0e8));
    ResolveIP(in_stack_fffffffffffff0d8);
    NetGroupManager::GetGroup(this_00,address);
    local_381 = 2;
    local_380 = 0x20;
    local_37f = 1;
    local_37e = 4;
    local_37d = 0x70;
    local_37c = 0xaf;
    std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)in_stack_fffffffffffff0a8);
    __l_08._M_len._0_7_ = in_stack_fffffffffffff0f8;
    __l_08._M_array = (iterator)in_stack_fffffffffffff0f0;
    __l_08._M_len._7_1_ = in_stack_fffffffffffff0ff;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT17(in_stack_fffffffffffff0ef,in_stack_fffffffffffff0e8),__l_08,
               (allocator_type *)in_stack_fffffffffffff0e0);
    std::operator==((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                    in_stack_fffffffffffff0d8,
                    (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                    in_stack_fffffffffffff0d0);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_fffffffffffff0bf,in_stack_fffffffffffff0b8),
               (bool)in_stack_fffffffffffff0b7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff0bf,in_stack_fffffffffffff0b8),
               (pointer)CONCAT17(in_stack_fffffffffffff0b7,in_stack_fffffffffffff0b0),
               (unsigned_long)in_stack_fffffffffffff0a8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff0b7,in_stack_fffffffffffff0b0),
               (basic_cstring<const_char> *)in_stack_fffffffffffff0a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff0bf,in_stack_fffffffffffff0b8),
               (pointer)CONCAT17(in_stack_fffffffffffff0b7,in_stack_fffffffffffff0b0),
               (unsigned_long)in_stack_fffffffffffff0a8);
    in_stack_fffffffffffff0a8 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)(local_a51 + 0x19),local_a98,local_ab8,0x150,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff0a8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff0a8);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT17(in_stack_fffffffffffff0bf,in_stack_fffffffffffff0b8));
    std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)in_stack_fffffffffffff0a8)
    ;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT17(in_stack_fffffffffffff0bf,in_stack_fffffffffffff0b8));
    CNetAddr::~CNetAddr((CNetAddr *)in_stack_fffffffffffff0a8);
    std::__cxx11::string::~string(in_stack_fffffffffffff0a8);
    std::allocator<char>::~allocator((allocator<char> *)local_a51);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff0bf,in_stack_fffffffffffff0b8),
               (pointer)CONCAT17(in_stack_fffffffffffff0b7,in_stack_fffffffffffff0b0),
               (unsigned_long)in_stack_fffffffffffff0a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff0a8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff0ef,in_stack_fffffffffffff0e8),
               in_stack_fffffffffffff0e0,(size_t)in_stack_fffffffffffff0d8,
               (const_string *)in_stack_fffffffffffff0d0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffff0ff,in_stack_fffffffffffff0f8),
               (char *)in_stack_fffffffffffff0f0,
               (allocator<char> *)CONCAT17(in_stack_fffffffffffff0ef,in_stack_fffffffffffff0e8));
    ResolveIP(in_stack_fffffffffffff0d8);
    NetGroupManager::GetGroup(this_00,address);
    local_386 = 2;
    local_385 = 0x20;
    local_384 = 1;
    local_383 = 0x20;
    local_382 = 1;
    std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)in_stack_fffffffffffff0a8);
    __l_09._M_len._0_7_ = in_stack_fffffffffffff0f8;
    __l_09._M_array = (iterator)in_stack_fffffffffffff0f0;
    __l_09._M_len._7_1_ = in_stack_fffffffffffff0ff;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT17(in_stack_fffffffffffff0ef,in_stack_fffffffffffff0e8),__l_09,
               (allocator_type *)in_stack_fffffffffffff0e0);
    in_stack_fffffffffffff0ff =
         std::operator==((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                         in_stack_fffffffffffff0d8,
                         (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                         in_stack_fffffffffffff0d0);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_fffffffffffff0bf,in_stack_fffffffffffff0b8),
               (bool)in_stack_fffffffffffff0b7);
    in_stack_fffffffffffff0f0 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff0bf,in_stack_fffffffffffff0b8),
               (pointer)CONCAT17(in_stack_fffffffffffff0b7,in_stack_fffffffffffff0b0),
               (unsigned_long)in_stack_fffffffffffff0a8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff0b7,in_stack_fffffffffffff0b0),
               (basic_cstring<const_char> *)in_stack_fffffffffffff0a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff0bf,in_stack_fffffffffffff0b8),
               (pointer)CONCAT17(in_stack_fffffffffffff0b7,in_stack_fffffffffffff0b0),
               (unsigned_long)in_stack_fffffffffffff0a8);
    in_stack_fffffffffffff0a8 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_af0,local_b50,local_b70,0x151,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff0a8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff0a8);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT17(in_stack_fffffffffffff0bf,in_stack_fffffffffffff0b8));
    std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)in_stack_fffffffffffff0a8)
    ;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT17(in_stack_fffffffffffff0bf,in_stack_fffffffffffff0b8));
    CNetAddr::~CNetAddr((CNetAddr *)in_stack_fffffffffffff0a8);
    std::__cxx11::string::~string(in_stack_fffffffffffff0a8);
    std::allocator<char>::~allocator(local_b09);
    in_stack_fffffffffffff0ef = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_fffffffffffff0ef);
  local_2d3 = 6;
  local_2d2 = 0x12;
  local_2d1 = 0x92;
  local_2d0 = 0x94;
  local_2cf = 0;
  local_2ce = 0xeb;
  local_2cd = 0x46;
  local_2cc = 7;
  local_2cb = 0xc4;
  local_2ca = 0xac;
  local_2c9 = 7;
  file = &local_b89;
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)in_stack_fffffffffffff0a8);
  __l_10._M_len._0_7_ = in_stack_fffffffffffff0f8;
  __l_10._M_array = (iterator)in_stack_fffffffffffff0f0;
  __l_10._M_len._7_1_ = in_stack_fffffffffffff0ff;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT17(in_stack_fffffffffffff0ef,in_stack_fffffffffffff0e8),__l_10,
             (allocator_type *)file);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)in_stack_fffffffffffff0a8);
  do {
    __x = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff0bf,in_stack_fffffffffffff0b8),
               (pointer)CONCAT17(in_stack_fffffffffffff0b7,in_stack_fffffffffffff0b0),
               (unsigned_long)in_stack_fffffffffffff0a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff0a8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff0ef,in_stack_fffffffffffff0e8),file
               ,(size_t)__x,(const_string *)in_stack_fffffffffffff0d0);
    in_stack_fffffffffffff0d0 = (string *)local_be1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffff0ff,in_stack_fffffffffffff0f8),
               (char *)in_stack_fffffffffffff0f0,
               (allocator<char> *)CONCAT17(in_stack_fffffffffffff0ef,in_stack_fffffffffffff0e8));
    CreateInternal(in_stack_fffffffffffff0d0);
    NetGroupManager::GetGroup(this_00,address);
    std::operator==((vector<unsigned_char,_std::allocator<unsigned_char>_> *)__x,
                    (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                    in_stack_fffffffffffff0d0);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_fffffffffffff0bf,in_stack_fffffffffffff0b8),
               (bool)in_stack_fffffffffffff0b7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff0bf,in_stack_fffffffffffff0b8),
               (pointer)CONCAT17(in_stack_fffffffffffff0b7,in_stack_fffffffffffff0b0),
               (unsigned_long)in_stack_fffffffffffff0a8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff0b7,in_stack_fffffffffffff0b0),
               (basic_cstring<const_char> *)in_stack_fffffffffffff0a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff0bf,in_stack_fffffffffffff0b8),
               (pointer)CONCAT17(in_stack_fffffffffffff0b7,in_stack_fffffffffffff0b0),
               (unsigned_long)in_stack_fffffffffffff0a8);
    in_stack_fffffffffffff0a8 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)(local_be1 + 0x19),local_c08,local_c28,0x155,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff0a8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff0a8);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT17(in_stack_fffffffffffff0bf,in_stack_fffffffffffff0b8));
    CNetAddr::~CNetAddr((CNetAddr *)in_stack_fffffffffffff0a8);
    std::__cxx11::string::~string(in_stack_fffffffffffff0a8);
    std::allocator<char>::~allocator((allocator<char> *)local_be1);
    in_stack_fffffffffffff0bf = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_fffffffffffff0bf);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT17(in_stack_fffffffffffff0bf,in_stack_fffffffffffff0b8));
  NetGroupManager::~NetGroupManager((NetGroupManager *)in_stack_fffffffffffff0a8);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(netbase_getgroup)
{
    NetGroupManager netgroupman{std::vector<bool>()}; // use /16
    BOOST_CHECK(netgroupman.GetGroup(ResolveIP("127.0.0.1")) == std::vector<unsigned char>({0})); // Local -> !Routable()
    BOOST_CHECK(netgroupman.GetGroup(ResolveIP("257.0.0.1")) == std::vector<unsigned char>({0})); // !Valid -> !Routable()
    BOOST_CHECK(netgroupman.GetGroup(ResolveIP("10.0.0.1")) == std::vector<unsigned char>({0})); // RFC1918 -> !Routable()
    BOOST_CHECK(netgroupman.GetGroup(ResolveIP("169.254.1.1")) == std::vector<unsigned char>({0})); // RFC3927 -> !Routable()
    BOOST_CHECK(netgroupman.GetGroup(ResolveIP("1.2.3.4")) == std::vector<unsigned char>({(unsigned char)NET_IPV4, 1, 2})); // IPv4
    BOOST_CHECK(netgroupman.GetGroup(ResolveIP("::FFFF:0:102:304")) == std::vector<unsigned char>({(unsigned char)NET_IPV4, 1, 2})); // RFC6145
    BOOST_CHECK(netgroupman.GetGroup(ResolveIP("64:FF9B::102:304")) == std::vector<unsigned char>({(unsigned char)NET_IPV4, 1, 2})); // RFC6052
    BOOST_CHECK(netgroupman.GetGroup(ResolveIP("2002:102:304:9999:9999:9999:9999:9999")) == std::vector<unsigned char>({(unsigned char)NET_IPV4, 1, 2})); // RFC3964
    BOOST_CHECK(netgroupman.GetGroup(ResolveIP("2001:0:9999:9999:9999:9999:FEFD:FCFB")) == std::vector<unsigned char>({(unsigned char)NET_IPV4, 1, 2})); // RFC4380
    BOOST_CHECK(netgroupman.GetGroup(ResolveIP("2001:470:abcd:9999:9999:9999:9999:9999")) == std::vector<unsigned char>({(unsigned char)NET_IPV6, 32, 1, 4, 112, 175})); //he.net
    BOOST_CHECK(netgroupman.GetGroup(ResolveIP("2001:2001:9999:9999:9999:9999:9999:9999")) == std::vector<unsigned char>({(unsigned char)NET_IPV6, 32, 1, 32, 1})); //IPv6

    // baz.net sha256 hash: 12929400eb4607c4ac075f087167e75286b179c693eb059a01774b864e8fe505
    std::vector<unsigned char> internal_group = {NET_INTERNAL, 0x12, 0x92, 0x94, 0x00, 0xeb, 0x46, 0x07, 0xc4, 0xac, 0x07};
    BOOST_CHECK(netgroupman.GetGroup(CreateInternal("baz.net")) == internal_group);
}